

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * ssl_msg_type(int ssl_ver,int msg)

{
  int msg_local;
  int ssl_ver_local;
  
  if (ssl_ver == 3) {
    if (msg == 0) {
      _msg_local = "Hello request";
      return _msg_local;
    }
    if (msg == 1) {
      _msg_local = "Client hello";
      return _msg_local;
    }
    if (msg == 2) {
      _msg_local = "Server hello";
      return _msg_local;
    }
    if (msg == 4) {
      _msg_local = "Newsession Ticket";
      return _msg_local;
    }
    if (msg == 5) {
      _msg_local = "End of early data";
      return _msg_local;
    }
    if (msg == 8) {
      _msg_local = "Encrypted Extensions";
      return _msg_local;
    }
    if (msg == 0xb) {
      _msg_local = "Certificate";
      return _msg_local;
    }
    if (msg == 0xc) {
      _msg_local = "Server key exchange";
      return _msg_local;
    }
    if (msg == 0xd) {
      _msg_local = "Request CERT";
      return _msg_local;
    }
    if (msg == 0xe) {
      _msg_local = "Server finished";
      return _msg_local;
    }
    if (msg == 0xf) {
      _msg_local = "CERT verify";
      return _msg_local;
    }
    if (msg == 0x10) {
      _msg_local = "Client key exchange";
      return _msg_local;
    }
    if (msg == 0x14) {
      _msg_local = "Finished";
      return _msg_local;
    }
    if (msg == 0x16) {
      _msg_local = "Certificate Status";
      return _msg_local;
    }
    if (msg == 0x17) {
      _msg_local = "Supplemental data";
      return _msg_local;
    }
    if (msg == 0x18) {
      _msg_local = "Key update";
      return _msg_local;
    }
    if (msg == 0x43) {
      _msg_local = "Next protocol";
      return _msg_local;
    }
    if (msg == 0xfe) {
      _msg_local = "Message hash";
      return _msg_local;
    }
  }
  _msg_local = "Unknown";
  return _msg_local;
}

Assistant:

static const char *ssl_msg_type(int ssl_ver, int msg)
{
#ifdef SSL2_VERSION_MAJOR
  if(ssl_ver == SSL2_VERSION_MAJOR) {
    switch(msg) {
    case SSL2_MT_ERROR:
      return "Error";
    case SSL2_MT_CLIENT_HELLO:
      return "Client hello";
    case SSL2_MT_CLIENT_MASTER_KEY:
      return "Client key";
    case SSL2_MT_CLIENT_FINISHED:
      return "Client finished";
    case SSL2_MT_SERVER_HELLO:
      return "Server hello";
    case SSL2_MT_SERVER_VERIFY:
      return "Server verify";
    case SSL2_MT_SERVER_FINISHED:
      return "Server finished";
    case SSL2_MT_REQUEST_CERTIFICATE:
      return "Request CERT";
    case SSL2_MT_CLIENT_CERTIFICATE:
      return "Client CERT";
    }
  }
  else
#endif
  if(ssl_ver == SSL3_VERSION_MAJOR) {
    switch(msg) {
    case SSL3_MT_HELLO_REQUEST:
      return "Hello request";
    case SSL3_MT_CLIENT_HELLO:
      return "Client hello";
    case SSL3_MT_SERVER_HELLO:
      return "Server hello";
#ifdef SSL3_MT_NEWSESSION_TICKET
    case SSL3_MT_NEWSESSION_TICKET:
      return "Newsession Ticket";
#endif
    case SSL3_MT_CERTIFICATE:
      return "Certificate";
    case SSL3_MT_SERVER_KEY_EXCHANGE:
      return "Server key exchange";
    case SSL3_MT_CLIENT_KEY_EXCHANGE:
      return "Client key exchange";
    case SSL3_MT_CERTIFICATE_REQUEST:
      return "Request CERT";
    case SSL3_MT_SERVER_DONE:
      return "Server finished";
    case SSL3_MT_CERTIFICATE_VERIFY:
      return "CERT verify";
    case SSL3_MT_FINISHED:
      return "Finished";
#ifdef SSL3_MT_CERTIFICATE_STATUS
    case SSL3_MT_CERTIFICATE_STATUS:
      return "Certificate Status";
#endif
#ifdef SSL3_MT_ENCRYPTED_EXTENSIONS
    case SSL3_MT_ENCRYPTED_EXTENSIONS:
      return "Encrypted Extensions";
#endif
#ifdef SSL3_MT_SUPPLEMENTAL_DATA
    case SSL3_MT_SUPPLEMENTAL_DATA:
      return "Supplemental data";
#endif
#ifdef SSL3_MT_END_OF_EARLY_DATA
    case SSL3_MT_END_OF_EARLY_DATA:
      return "End of early data";
#endif
#ifdef SSL3_MT_KEY_UPDATE
    case SSL3_MT_KEY_UPDATE:
      return "Key update";
#endif
#ifdef SSL3_MT_NEXT_PROTO
    case SSL3_MT_NEXT_PROTO:
      return "Next protocol";
#endif
#ifdef SSL3_MT_MESSAGE_HASH
    case SSL3_MT_MESSAGE_HASH:
      return "Message hash";
#endif
    }
  }
  return "Unknown";
}